

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O3

void __thiscall Potassco::AspifTextInput::matchAgg(AspifTextInput *this)

{
  uint uVar1;
  bool bVar2;
  Atom_t AVar3;
  uint uVar4;
  ulong uVar5;
  
  bVar2 = match(this,"{",true);
  if ((bVar2) && (bVar2 = match(this,"}",false), !bVar2)) {
    do {
      bVar2 = match(this,"not ",false);
      AVar3 = matchId(this);
      uVar1 = -AVar3;
      if (!bVar2) {
        uVar1 = AVar3;
      }
      bVar2 = match(this,"=",false);
      uVar5 = 0x100000000;
      if (bVar2) {
        uVar4 = matchInt(this);
        uVar5 = (ulong)uVar4 << 0x20;
      }
      RuleBuilder::addGoal(&this->data_->rule,(WeightLit_t)(uVar1 | uVar5));
      bVar2 = match(this,",",false);
    } while (bVar2);
    match(this,"}",true);
    return;
  }
  return;
}

Assistant:

void AspifTextInput::matchAgg() {
	if (match("{") && !match("}", false)) {
		do {
			WeightLit_t wl = {matchLit(), 1};
			if (match("=", false)) { wl.weight = matchInt(); }
			data_->rule.addGoal(wl);
		}
		while (match(",", false));
		match("}");
	}
}